

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

FieldSourceInfoBuilderPair * __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::addMemberSchema
          (FieldSourceInfoBuilderPair *__return_storage_ptr__,MemberInfo *this)

{
  bool bVar1;
  Builder structNode;
  Builder local_98;
  ListBuilder local_70;
  ListBuilder local_48;
  
  if (this->childInitializedCount < this->childCount) {
    local_98._builder.dataSize = (this->node)._builder.dataSize;
    local_98._builder.pointerCount = (this->node)._builder.pointerCount;
    local_98._builder._38_2_ = *(undefined2 *)&(this->node)._builder.field_0x26;
    local_98._builder.segment = (this->node)._builder.segment;
    local_98._builder.capTable = (this->node)._builder.capTable;
    local_98._builder.data = (this->node)._builder.data;
    local_98._builder.pointers = (this->node)._builder.pointers;
    bVar1 = capnp::schema::Node::Struct::Builder::hasFields(&local_98);
    if (bVar1) {
      capnp::schema::Node::Struct::Builder::getFields((Builder *)&local_70,&local_98);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_70,this->childInitializedCount);
      capnp::schema::Node::SourceInfo::Builder::getMembers((Builder *)&local_48,&this->sourceInfo);
    }
    else {
      if (this->parent != (MemberInfo *)0x0) {
        getSchema((Builder *)&local_70,this);
      }
      capnp::schema::Node::Struct::Builder::initFields
                ((Builder *)&local_70,&local_98,this->childCount);
      capnp::_::ListBuilder::getStructElement
                ((StructBuilder *)__return_storage_ptr__,&local_70,this->childInitializedCount);
      capnp::schema::Node::SourceInfo::Builder::initMembers
                ((Builder *)&local_48,&this->sourceInfo,this->childCount);
    }
    capnp::_::ListBuilder::getStructElement
              (&(__return_storage_ptr__->sourceInfo)._builder,&local_48,this->childInitializedCount)
    ;
    this->childInitializedCount = this->childInitializedCount + 1;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x780,FAILED,"childInitializedCount < childCount","");
  kj::_::Debug::Fault::fatal((Fault *)&local_98);
}

Assistant:

addMemberSchema() {
      // Get the schema builder for the child member at the given index.  This lazily/dynamically
      // builds the builder tree.

      KJ_REQUIRE(childInitializedCount < childCount);

      auto structNode = node.getStruct();
      if (!structNode.hasFields()) {
        if (parent != nullptr) {
          getSchema();  // Make sure field exists in parent once the first child is added.
        }
        FieldSourceInfoBuilderPair result {
          structNode.initFields(childCount)[childInitializedCount],
          sourceInfo.initMembers(childCount)[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      } else {
        FieldSourceInfoBuilderPair result {
          structNode.getFields()[childInitializedCount],
          sourceInfo.getMembers()[childInitializedCount]
        };
        ++childInitializedCount;
        return result;
      }
    }